

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

ostream * node::operator<<(ostream *os,BlockfileCursor *cursor)

{
  long lVar1;
  int *in_RSI;
  ostream *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  ostream *poVar2;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  poVar2 = in_RDI;
  tinyformat::format<int,int>(in_stack_ffffffffffffffd8,(int *)in_RDI,in_RSI);
  std::operator<<(in_RDI,(string *)&stack0xffffffffffffffd8);
  std::__cxx11::string::~string(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return poVar2;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BlockfileCursor& cursor) {
    os << strprintf("BlockfileCursor(file_num=%d, undo_height=%d)", cursor.file_num, cursor.undo_height);
    return os;
}